

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O2

void __thiscall bitio::bitio_stream::skip(bitio_stream *this,uint64_t n)

{
  while (n != 0) {
    if (n < 0x41) {
      lim_skip(this,(uint8_t)n);
      n = 0;
    }
    else {
      lim_skip(this,'@');
      n = n - 0x40;
    }
  }
  return;
}

Assistant:

void bitio_stream::skip(uint64_t n) {
    while (n > 0) {
        if (n > 0x40) {
            lim_skip(0x40);
            n -= 0x40;
        } else {
            lim_skip(n);
            n = 0;
        }
    }
}